

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[33],unsigned_int,char[43],unsigned_int,char[48]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],uint *Args_1,
          char (*Args_2) [43],uint *Args_3,char (*Args_4) [48])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [48];
  uint *Args_local_3;
  char (*Args_local_2) [43];
  uint *Args_local_1;
  char (*Args_local) [33];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[33],unsigned_int,char[43],unsigned_int,char[48]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [33])this,(uint *)Args,(char (*) [43])Args_1,(uint *)Args_2,
             (char (*) [48])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}